

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_GLUpload(ktxTexture2 *This,GLuint *pTexture,GLenum *pTarget,GLenum *pGlerror)

{
  ktx_uint32_t kVar1;
  bool bVar2;
  ktx_error_code_e kVar3;
  GLint previousUnpackAlignment;
  ktx_glformatinfo local_44;
  int local_34;
  
  if (pTarget == (GLenum *)0x0 || This == (ktxTexture2 *)0x0) {
    return KTX_INVALID_VALUE;
  }
  kVar3 = ktxLoadOpenGL((PFNGLGETPROCADDRESS)0x0);
  if (kVar3 != KTX_SUCCESS) {
    return kVar3;
  }
  kVar1 = This->vkFormat;
  kVar3 = KTX_INVALID_OPERATION;
  if (kVar1 == 0) {
    return KTX_INVALID_OPERATION;
  }
  local_44.glInternalformat = 0x8056;
  if ((int)kVar1 < 0x3b9f2f00) {
    switch(kVar1) {
    case 2:
    case 3:
      break;
    case 4:
    case 5:
      local_44.glInternalformat = 0x8d62;
      break;
    case 6:
    case 7:
    case 8:
switchD_001dab11_caseD_6:
      local_44.glInternalformat = 0x8057;
      break;
    case 9:
      local_44.glInternalformat = 0x8229;
      break;
    case 10:
      local_44.glInternalformat = 0x8f94;
      break;
    case 0xb:
    case 0xc:
    case 0x12:
    case 0x13:
    case 0x19:
    case 0x1a:
    case 0x20:
    case 0x21:
    case 0x27:
    case 0x28:
    case 0x2e:
    case 0x2f:
    case 0x35:
    case 0x36:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3f:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4f:
    case 0x50:
    case 0x56:
    case 0x57:
    case 0x5d:
    case 0x5e:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7d:
    case 0x80:
      goto switchD_001dab11_caseD_b;
    case 0xd:
      local_44.glInternalformat = 0x8232;
      break;
    case 0xe:
      local_44.glInternalformat = 0x8231;
      break;
    case 0xf:
      local_44.glInternalformat = 0x8fbd;
      break;
    case 0x10:
      local_44.glInternalformat = 0x822b;
      break;
    case 0x11:
      local_44.glInternalformat = 0x8f95;
      break;
    case 0x14:
      local_44.glInternalformat = 0x8238;
      break;
    case 0x15:
      local_44.glInternalformat = 0x8237;
      break;
    case 0x16:
      local_44.glInternalformat = 0x8fbe;
      break;
    case 0x17:
    case 0x1e:
      local_44.glInternalformat = 0x8051;
      break;
    case 0x18:
    case 0x1f:
      local_44.glInternalformat = 0x8f96;
      break;
    case 0x1b:
    case 0x22:
      local_44.glInternalformat = 0x8d7d;
      break;
    case 0x1c:
    case 0x23:
      local_44.glInternalformat = 0x8d8f;
      break;
    case 0x1d:
    case 0x24:
      local_44.glInternalformat = 0x8c41;
      break;
    case 0x25:
    case 0x2c:
    case 0x33:
      local_44.glInternalformat = 0x8058;
      break;
    case 0x26:
    case 0x2d:
    case 0x34:
      local_44.glInternalformat = 0x8f97;
      break;
    case 0x29:
    case 0x30:
    case 0x37:
      local_44.glInternalformat = 0x8d7c;
      break;
    case 0x2a:
    case 0x31:
    case 0x38:
      local_44.glInternalformat = 0x8d8e;
      break;
    case 0x2b:
    case 0x32:
    case 0x39:
      local_44.glInternalformat = 0x8c43;
      break;
    case 0x3a:
    case 0x40:
      local_44.glInternalformat = 0x8059;
      break;
    case 0x3e:
    case 0x44:
      local_44.glInternalformat = 0x906f;
      break;
    case 0x46:
      local_44.glInternalformat = 0x822a;
      break;
    case 0x47:
      local_44.glInternalformat = 0x8f98;
      break;
    case 0x4a:
      local_44.glInternalformat = 0x8234;
      break;
    case 0x4b:
      local_44.glInternalformat = 0x8233;
      break;
    case 0x4c:
      local_44.glInternalformat = 0x822d;
      break;
    case 0x4d:
      local_44.glInternalformat = 0x822c;
      break;
    case 0x4e:
      local_44.glInternalformat = 0x8f99;
      break;
    case 0x51:
      local_44.glInternalformat = 0x823a;
      break;
    case 0x52:
      local_44.glInternalformat = 0x8239;
      break;
    case 0x53:
      local_44.glInternalformat = 0x822f;
      break;
    case 0x54:
      local_44.glInternalformat = 0x8054;
      break;
    case 0x55:
      local_44.glInternalformat = 0x8f9a;
      break;
    case 0x58:
      local_44.glInternalformat = 0x8d77;
      break;
    case 0x59:
      local_44.glInternalformat = 0x8d89;
      break;
    case 0x5a:
      local_44.glInternalformat = 0x881b;
      break;
    case 0x5b:
      local_44.glInternalformat = 0x805b;
      break;
    case 0x5c:
      local_44.glInternalformat = 0x8f9b;
      break;
    case 0x5f:
      local_44.glInternalformat = 0x8d76;
      break;
    case 0x60:
      local_44.glInternalformat = 0x8d88;
      break;
    case 0x61:
      local_44.glInternalformat = 0x881a;
      break;
    case 0x62:
      local_44.glInternalformat = 0x8236;
      break;
    case 99:
      local_44.glInternalformat = 0x8235;
      break;
    case 100:
      local_44.glInternalformat = 0x822e;
      break;
    case 0x65:
      local_44.glInternalformat = 0x823c;
      break;
    case 0x66:
      local_44.glInternalformat = 0x823b;
      break;
    case 0x67:
      local_44.glInternalformat = 0x8230;
      break;
    case 0x68:
      local_44.glInternalformat = 0x8d71;
      break;
    case 0x69:
      local_44.glInternalformat = 0x8d83;
      break;
    case 0x6a:
      local_44.glInternalformat = 0x8815;
      break;
    case 0x6b:
      local_44.glInternalformat = 0x8d70;
      break;
    case 0x6c:
      local_44.glInternalformat = 0x8d82;
      break;
    case 0x6d:
      local_44.glInternalformat = 0x8814;
      break;
    case 0x7a:
      local_44.glInternalformat = 0x8c3a;
      break;
    case 0x7b:
      local_44.glInternalformat = 0x8c3d;
      break;
    case 0x7c:
      local_44.glInternalformat = 0x81a5;
      break;
    case 0x7e:
      local_44.glInternalformat = 0x8cac;
      break;
    case 0x7f:
      local_44.glInternalformat = 0x8d48;
      break;
    case 0x81:
      local_44.glInternalformat = 0x88f0;
      break;
    case 0x82:
      local_44.glInternalformat = 0x8cad;
      break;
    case 0x83:
      local_44.glInternalformat = 0x83f0;
      break;
    case 0x84:
      local_44.glInternalformat = 0x8c4c;
      break;
    case 0x85:
      local_44.glInternalformat = 0x83f1;
      break;
    case 0x86:
      local_44.glInternalformat = 0x8c4d;
      break;
    case 0x87:
      local_44.glInternalformat = 0x83f2;
      break;
    case 0x88:
      local_44.glInternalformat = 0x8c4e;
      break;
    case 0x89:
      local_44.glInternalformat = 0x83f3;
      break;
    case 0x8a:
      local_44.glInternalformat = 0x8c4f;
      break;
    case 0x8b:
      local_44.glInternalformat = 0x8dbb;
      break;
    case 0x8c:
      local_44.glInternalformat = 0x8dbc;
      break;
    case 0x8d:
      local_44.glInternalformat = 0x8dbd;
      break;
    case 0x8e:
      local_44.glInternalformat = 0x8dbe;
      break;
    case 0x8f:
      local_44.glInternalformat = 0x8e8f;
      break;
    case 0x90:
      local_44.glInternalformat = 0x8e8e;
      break;
    case 0x91:
      local_44.glInternalformat = 0x8e8c;
      break;
    case 0x92:
      local_44.glInternalformat = 0x8e8d;
      break;
    case 0x93:
      local_44.glInternalformat = 0x9274;
      break;
    case 0x94:
      local_44.glInternalformat = 0x9275;
      break;
    case 0x95:
      local_44.glInternalformat = 0x9276;
      break;
    case 0x96:
      local_44.glInternalformat = 0x9277;
      break;
    case 0x97:
      local_44.glInternalformat = 0x9278;
      break;
    case 0x98:
      local_44.glInternalformat = 0x9279;
      break;
    case 0x99:
      local_44.glInternalformat = 0x9270;
      break;
    case 0x9a:
      local_44.glInternalformat = 0x9271;
      break;
    case 0x9b:
      local_44.glInternalformat = 0x9272;
      break;
    case 0x9c:
      local_44.glInternalformat = 0x9273;
      break;
    case 0x9d:
switchD_001dab11_caseD_9d:
      local_44.glInternalformat = 0x93b0;
      break;
    case 0x9e:
      local_44.glInternalformat = 0x93d0;
      break;
    case 0x9f:
switchD_001dab11_caseD_9f:
      local_44.glInternalformat = 0x93b1;
      break;
    case 0xa0:
      local_44.glInternalformat = 0x93d1;
      break;
    case 0xa1:
switchD_001dab11_caseD_a1:
      local_44.glInternalformat = 0x93b2;
      break;
    case 0xa2:
      local_44.glInternalformat = 0x93d2;
      break;
    case 0xa3:
switchD_001dab11_caseD_a3:
      local_44.glInternalformat = 0x93b3;
      break;
    case 0xa4:
      local_44.glInternalformat = 0x93d3;
      break;
    case 0xa5:
switchD_001dab11_caseD_a5:
      local_44.glInternalformat = 0x93b4;
      break;
    case 0xa6:
      local_44.glInternalformat = 0x93d4;
      break;
    case 0xa7:
switchD_001dab11_caseD_a7:
      local_44.glInternalformat = 0x93b5;
      break;
    case 0xa8:
      local_44.glInternalformat = 0x93d5;
      break;
    case 0xa9:
switchD_001dab11_caseD_a9:
      local_44.glInternalformat = 0x93b6;
      break;
    case 0xaa:
      local_44.glInternalformat = 0x93d6;
      break;
    case 0xab:
switchD_001dab11_caseD_ab:
      local_44.glInternalformat = 0x93b7;
      break;
    case 0xac:
      local_44.glInternalformat = 0x93d7;
      break;
    case 0xad:
switchD_001dab11_caseD_ad:
      local_44.glInternalformat = 0x93b8;
      break;
    case 0xae:
      local_44.glInternalformat = 0x93d8;
      break;
    case 0xaf:
switchD_001dab11_caseD_af:
      local_44.glInternalformat = 0x93b9;
      break;
    case 0xb0:
      local_44.glInternalformat = 0x93d9;
      break;
    case 0xb1:
switchD_001dab11_caseD_b1:
      local_44.glInternalformat = 0x93ba;
      break;
    case 0xb2:
      local_44.glInternalformat = 0x93da;
      break;
    case 0xb3:
switchD_001dab11_caseD_b3:
      local_44.glInternalformat = 0x93bb;
      break;
    case 0xb4:
      local_44.glInternalformat = 0x93db;
      break;
    case 0xb5:
switchD_001dab11_caseD_b5:
      local_44.glInternalformat = 0x93bc;
      break;
    case 0xb6:
      local_44.glInternalformat = 0x93dc;
      break;
    case 0xb7:
switchD_001dab11_caseD_b7:
      local_44.glInternalformat = 0x93bd;
      break;
    case 0xb8:
      local_44.glInternalformat = 0x93dd;
      break;
    default:
      switch(kVar1) {
      case 0x3b9bcbd0:
        goto switchD_001dab11_caseD_9d;
      case 0x3b9bcbd1:
        goto switchD_001dab11_caseD_9f;
      case 0x3b9bcbd2:
        goto switchD_001dab11_caseD_a1;
      case 0x3b9bcbd3:
        goto switchD_001dab11_caseD_a3;
      case 0x3b9bcbd4:
        goto switchD_001dab11_caseD_a5;
      case 0x3b9bcbd5:
        goto switchD_001dab11_caseD_a7;
      case 0x3b9bcbd6:
        goto switchD_001dab11_caseD_a9;
      case 0x3b9bcbd7:
        goto switchD_001dab11_caseD_ab;
      case 0x3b9bcbd8:
        goto switchD_001dab11_caseD_ad;
      case 0x3b9bcbd9:
        goto switchD_001dab11_caseD_af;
      case 0x3b9bcbda:
        goto switchD_001dab11_caseD_b1;
      case 0x3b9bcbdb:
        goto switchD_001dab11_caseD_b3;
      case 0x3b9bcbdc:
        goto switchD_001dab11_caseD_b5;
      case 0x3b9bcbdd:
        goto switchD_001dab11_caseD_b7;
      default:
        switch(kVar1) {
        case 0x3b9b9cf0:
          local_44.glInternalformat = 0x8c03;
          break;
        case 0x3b9b9cf1:
          local_44.glInternalformat = 0x8c02;
          break;
        case 0x3b9b9cf2:
          local_44.glInternalformat = 0x9137;
          break;
        case 0x3b9b9cf3:
          local_44.glInternalformat = 0x9138;
          break;
        case 0x3b9b9cf4:
          local_44.glInternalformat = 0x8a56;
          break;
        case 0x3b9b9cf5:
          local_44.glInternalformat = 0x8a57;
          break;
        case 0x3b9b9cf6:
          local_44.glInternalformat = 0x93f0;
          break;
        case 0x3b9b9cf7:
          local_44.glInternalformat = 0x93f1;
          break;
        default:
          goto switchD_001dab11_caseD_b;
        }
      }
    }
  }
  else if ((int)kVar1 < 0x3b9ffa20) {
    switch(kVar1) {
    case 0x3b9f2f00:
    case 0x3b9f2f02:
      local_44.glInternalformat = 0x93c0;
      break;
    case 0x3b9f2f01:
      local_44.glInternalformat = 0x93e0;
      break;
    case 0x3b9f2f03:
    case 0x3b9f2f05:
      local_44.glInternalformat = 0x93c1;
      break;
    case 0x3b9f2f04:
      local_44.glInternalformat = 0x93e1;
      break;
    case 0x3b9f2f06:
    case 0x3b9f2f08:
      local_44.glInternalformat = 0x93c2;
      break;
    case 0x3b9f2f07:
      local_44.glInternalformat = 0x93e2;
      break;
    case 0x3b9f2f09:
    case 0x3b9f2f0b:
      local_44.glInternalformat = 0x93c3;
      break;
    case 0x3b9f2f0a:
      local_44.glInternalformat = 0x93e3;
      break;
    case 0x3b9f2f0c:
    case 0x3b9f2f0e:
      local_44.glInternalformat = 0x93c4;
      break;
    case 0x3b9f2f0d:
      local_44.glInternalformat = 0x93e4;
      break;
    case 0x3b9f2f0f:
    case 0x3b9f2f11:
      local_44.glInternalformat = 0x93c5;
      break;
    case 0x3b9f2f10:
      local_44.glInternalformat = 0x93e5;
      break;
    case 0x3b9f2f12:
    case 0x3b9f2f14:
      local_44.glInternalformat = 0x93c6;
      break;
    case 0x3b9f2f13:
      local_44.glInternalformat = 0x93e6;
      break;
    case 0x3b9f2f15:
    case 0x3b9f2f17:
      local_44.glInternalformat = 0x93c7;
      break;
    case 0x3b9f2f16:
      local_44.glInternalformat = 0x93e7;
      break;
    case 0x3b9f2f18:
    case 0x3b9f2f1a:
      local_44.glInternalformat = 0x93c8;
      break;
    case 0x3b9f2f19:
      local_44.glInternalformat = 0x93e8;
      break;
    case 0x3b9f2f1b:
    case 0x3b9f2f1d:
      local_44.glInternalformat = 0x93c9;
      break;
    case 0x3b9f2f1c:
      local_44.glInternalformat = 0x93e9;
      break;
    default:
      goto switchD_001dab11_caseD_b;
    }
  }
  else if (1 < kVar1 + 0xc46005e0) {
    if (kVar1 == 0x3ba1f5f0) goto switchD_001dab11_caseD_6;
    if (kVar1 != 0x3ba1f5f1) {
      return KTX_INVALID_OPERATION;
    }
    local_44.glInternalformat = 0x803c;
  }
  if (This->isCompressed == true) {
    local_44.glFormat = 0x501;
    local_44.glType = 0x501;
    local_44.glBaseInternalformat = 0x501;
    goto LAB_001db132;
  }
  local_44.glFormat = 0x1908;
  bVar2 = false;
  local_44.glBaseInternalformat = local_44.glInternalformat;
  if (0x3b9ffa1f < (int)kVar1) {
    if ((int)kVar1 < 0x3ba1f5f0) {
      if (kVar1 == 0x3b9ffa20) {
        local_44.glFormat = 0x80e1;
        local_44.glType = 0x8365;
        goto LAB_001db132;
      }
      if (kVar1 != 0x3b9ffa21) goto switchD_001db1be_caseD_b;
    }
    else if (kVar1 != 0x3ba1f5f0) {
      if (kVar1 != 0x3ba1f5f1) goto switchD_001db1be_caseD_b;
      local_44.glFormat = 0x1906;
      goto LAB_001db556;
    }
    goto switchD_001db1be_caseD_2;
  }
  bVar2 = false;
  switch(kVar1) {
  case 2:
  case 6:
  case 0x25:
  case 0x26:
  case 0x2b:
  case 0x33:
  case 0x34:
  case 0x39:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x61:
  case 0x6d:
    goto switchD_001db1be_caseD_2;
  case 3:
    local_44.glFormat = 0x80e1;
    local_44.glType = 0x8033;
    break;
  case 4:
    local_44.glFormat = 0x1907;
    local_44.glType = 0x8363;
    break;
  case 5:
    local_44.glFormat = 0x1907;
    local_44.glType = 0x8364;
    break;
  case 7:
    local_44.glFormat = 0x80e1;
    local_44.glType = 0x8034;
    break;
  case 8:
    local_44.glFormat = 0x80e1;
    local_44.glType = 0x8366;
    break;
  case 9:
  case 0xf:
    local_44.glFormat = 0x1903;
    goto LAB_001db556;
  case 10:
    local_44.glFormat = 0x1903;
    goto LAB_001db544;
  default:
switchD_001db1be_caseD_b:
    local_44.glFormat = 0x501;
    bVar2 = true;
switchD_001db1be_caseD_2:
    if ((int)kVar1 < 0x3b9ffa20) {
      switch(kVar1) {
      case 2:
      case 3:
        local_44.glType = 0x8033;
        break;
      case 4:
        local_44.glType = 0x8363;
        break;
      case 5:
        local_44.glType = 0x8364;
        break;
      case 6:
      case 7:
        local_44.glType = 0x8034;
        break;
      case 8:
switchD_001db1ed_caseD_8:
        local_44.glType = 0x8366;
        break;
      case 9:
      case 0xd:
      case 0xf:
      case 0x10:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x1b:
      case 0x1d:
      case 0x1e:
      case 0x22:
      case 0x24:
      case 0x25:
      case 0x29:
      case 0x2b:
      case 0x2c:
      case 0x30:
      case 0x32:
      case 0x33:
      case 0x37:
      case 0x39:
      case 0x7f:
switchD_001db1ed_caseD_9:
        local_44.glType = 0x1401;
        break;
      case 10:
      case 0xe:
      case 0x11:
      case 0x15:
      case 0x18:
      case 0x1c:
      case 0x1f:
      case 0x23:
      case 0x26:
      case 0x2a:
      case 0x2d:
      case 0x31:
      case 0x34:
      case 0x38:
        local_44.glType = 0x1400;
        break;
      default:
        return KTX_INVALID_OPERATION;
      case 0x3a:
      case 0x3e:
      case 0x40:
      case 0x44:
        local_44.glType = 0x8368;
        break;
      case 0x46:
      case 0x4a:
      case 0x4d:
      case 0x51:
      case 0x54:
      case 0x58:
      case 0x5b:
      case 0x5f:
      case 0x7c:
        local_44.glType = 0x1403;
        break;
      case 0x47:
      case 0x4b:
      case 0x4e:
      case 0x52:
      case 0x55:
      case 0x59:
      case 0x5c:
      case 0x60:
        local_44.glType = 0x1402;
        break;
      case 0x4c:
      case 0x53:
      case 0x5a:
      case 0x61:
        local_44.glType = 0x140b;
        break;
      case 0x62:
      case 0x65:
      case 0x68:
      case 0x6b:
        local_44.glType = 0x1405;
        break;
      case 99:
      case 0x66:
      case 0x69:
      case 0x6c:
        local_44.glType = 0x1404;
        break;
      case 100:
      case 0x67:
      case 0x6a:
      case 0x6d:
      case 0x7e:
        local_44.glType = 0x1406;
        break;
      case 0x7a:
        local_44.glType = 0x8c3b;
        break;
      case 0x7b:
        local_44.glType = 0x8c3e;
        break;
      case 0x81:
        local_44.glType = 0x84fa;
        break;
      case 0x82:
        local_44.glType = 0x8dad;
      }
    }
    else {
      if (0x3ba1f5ef < (int)kVar1) {
        if (kVar1 != 0x3ba1f5f0) {
          if (kVar1 != 0x3ba1f5f1) {
            return KTX_INVALID_OPERATION;
          }
          goto switchD_001db1ed_caseD_9;
        }
        goto switchD_001db1ed_caseD_8;
      }
      if ((kVar1 != 0x3b9ffa20) && (kVar1 != 0x3b9ffa21)) {
        return KTX_INVALID_OPERATION;
      }
      local_44.glType = 0x8365;
    }
    if (bVar2) {
      return KTX_INVALID_OPERATION;
    }
    break;
  case 0xd:
    local_44.glFormat = 0x8d94;
    goto LAB_001db556;
  case 0xe:
    local_44.glFormat = 0x8d94;
    goto LAB_001db544;
  case 0x10:
  case 0x16:
    local_44.glFormat = 0x8227;
    goto LAB_001db556;
  case 0x11:
    local_44.glFormat = 0x8227;
    goto LAB_001db544;
  case 0x14:
    local_44.glFormat = 0x8228;
    goto LAB_001db556;
  case 0x15:
    local_44.glFormat = 0x8228;
    goto LAB_001db544;
  case 0x17:
  case 0x1d:
    local_44.glFormat = 0x1907;
    goto LAB_001db556;
  case 0x18:
    local_44.glFormat = 0x1907;
    goto LAB_001db544;
  case 0x1b:
    local_44.glFormat = 0x8d98;
    goto LAB_001db556;
  case 0x1c:
    local_44.glFormat = 0x8d98;
    goto LAB_001db544;
  case 0x1e:
  case 0x24:
    local_44.glFormat = 0x80e0;
    goto LAB_001db556;
  case 0x1f:
    local_44.glFormat = 0x80e0;
    goto LAB_001db544;
  case 0x22:
    local_44.glFormat = 0x8d9a;
    goto LAB_001db556;
  case 0x23:
    local_44.glFormat = 0x8d9a;
    goto LAB_001db544;
  case 0x29:
  case 0x37:
    local_44.glFormat = 0x8d99;
    goto LAB_001db556;
  case 0x2a:
  case 0x38:
    local_44.glFormat = 0x8d99;
    goto LAB_001db544;
  case 0x2c:
  case 0x32:
    local_44.glFormat = 0x80e1;
    goto LAB_001db556;
  case 0x2d:
    local_44.glFormat = 0x80e1;
    goto LAB_001db544;
  case 0x30:
    local_44.glFormat = 0x8d9b;
    goto LAB_001db556;
  case 0x31:
    local_44.glFormat = 0x8d9b;
LAB_001db544:
    local_44.glType = 0x1400;
    break;
  case 0x3a:
    local_44.glFormat = 0x80e1;
    goto LAB_001db40a;
  case 0x3e:
    local_44.glFormat = 0x8d9b;
    goto LAB_001db40a;
  case 0x44:
    local_44.glFormat = 0x8d99;
LAB_001db40a:
    local_44.glType = 0x8368;
    break;
  case 0x46:
    local_44.glFormat = 0x1903;
    goto LAB_001db4f7;
  case 0x47:
    local_44.glFormat = 0x1903;
    goto LAB_001db58e;
  case 0x4a:
    local_44.glFormat = 0x8d94;
    goto LAB_001db4f7;
  case 0x4b:
    local_44.glFormat = 0x8d94;
    goto LAB_001db58e;
  case 0x4c:
    local_44.glFormat = 0x1903;
    goto LAB_001db520;
  case 0x4d:
    local_44.glFormat = 0x8227;
    goto LAB_001db4f7;
  case 0x4e:
    local_44.glFormat = 0x8227;
    goto LAB_001db58e;
  case 0x51:
    local_44.glFormat = 0x8228;
    goto LAB_001db4f7;
  case 0x52:
    local_44.glFormat = 0x8228;
    goto LAB_001db58e;
  case 0x53:
    local_44.glFormat = 0x8227;
    goto LAB_001db520;
  case 0x54:
    local_44.glFormat = 0x1907;
    goto LAB_001db4f7;
  case 0x55:
    local_44.glFormat = 0x1907;
    goto LAB_001db58e;
  case 0x58:
    local_44.glFormat = 0x8d98;
    goto LAB_001db4f7;
  case 0x59:
    local_44.glFormat = 0x8d98;
    goto LAB_001db58e;
  case 0x5a:
    local_44.glFormat = 0x1907;
LAB_001db520:
    local_44.glType = 0x140b;
    break;
  case 0x5f:
    local_44.glFormat = 0x8d99;
    goto LAB_001db4f7;
  case 0x60:
    local_44.glFormat = 0x8d99;
LAB_001db58e:
    local_44.glType = 0x1402;
    break;
  case 0x62:
    local_44.glFormat = 0x8d94;
    goto LAB_001db5d8;
  case 99:
    local_44.glFormat = 0x8d94;
    goto LAB_001db532;
  case 100:
    local_44.glFormat = 0x1903;
    goto LAB_001db5bc;
  case 0x65:
    local_44.glFormat = 0x8228;
    goto LAB_001db5d8;
  case 0x66:
    local_44.glFormat = 0x8228;
    goto LAB_001db532;
  case 0x67:
    local_44.glFormat = 0x8227;
    goto LAB_001db5bc;
  case 0x68:
    local_44.glFormat = 0x8d98;
    goto LAB_001db5d8;
  case 0x69:
    local_44.glFormat = 0x8d98;
    goto LAB_001db532;
  case 0x6a:
    local_44.glFormat = 0x1907;
    goto LAB_001db5bc;
  case 0x6b:
    local_44.glFormat = 0x8d99;
LAB_001db5d8:
    local_44.glType = 0x1405;
    break;
  case 0x6c:
    local_44.glFormat = 0x8d99;
LAB_001db532:
    local_44.glType = 0x1404;
    break;
  case 0x7a:
    local_44.glFormat = 0x1907;
    local_44.glType = 0x8c3b;
    break;
  case 0x7b:
    local_44.glFormat = 0x1907;
    local_44.glType = 0x8c3e;
    break;
  case 0x7c:
    local_44.glFormat = 0x1902;
LAB_001db4f7:
    local_44.glType = 0x1403;
    break;
  case 0x7e:
    local_44.glFormat = 0x1902;
LAB_001db5bc:
    local_44.glType = 0x1406;
    break;
  case 0x7f:
    local_44.glFormat = 0x1901;
LAB_001db556:
    local_44.glType = 0x1401;
    break;
  case 0x81:
    local_44.glFormat = 0x84f9;
    local_44.glType = 0x84fa;
    break;
  case 0x82:
    local_44.glFormat = 0x84f9;
    local_44.glType = 0x8dad;
  }
LAB_001db132:
  (*gl.glGetIntegerv)(0xcf5,&local_34);
  if (local_34 != 1) {
    (*gl.glPixelStorei)(0xcf5,1);
  }
  kVar3 = ktxTexture_GLUploadPrivate((ktxTexture *)This,&local_44,pTexture,pTarget,pGlerror);
  if (local_34 != 1) {
    (*gl.glPixelStorei)(0xcf5,local_34);
  }
switchD_001dab11_caseD_b:
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_GLUpload(ktxTexture2* This, GLuint* pTexture, GLenum* pTarget,
                     GLenum* pGlerror)
{
    GLint                 previousUnpackAlignment;
    ktx_error_code_e      result = KTX_SUCCESS;
    ktx_glformatinfo      formatInfo;

    if (!This) {
        return KTX_INVALID_VALUE;
    }

    if (!pTarget) {
        return KTX_INVALID_VALUE;
    }

    result = ktxLoadOpenGL(NULL);
    if (result != KTX_SUCCESS) {
        return result;
    }

    if (This->vkFormat != VK_FORMAT_UNDEFINED) {
        formatInfo.glInternalformat =
                            vkFormat2glInternalFormat(This->vkFormat);
        if (formatInfo.glInternalformat == GL_INVALID_VALUE) {
            // TODO Check for mapping metadata. If none
            return KTX_INVALID_OPERATION;
        }
    } else {
       // TODO: Check DFD for ASTC HDR or 3D or RGB[DEM] and figure out format.
       return KTX_INVALID_OPERATION; // BasisU textures must be transcoded
                                     // before upload.
    }

    if (This->isCompressed) {
        /* Unused. */
        formatInfo.glFormat = GL_INVALID_VALUE;
        formatInfo.glType = GL_INVALID_VALUE;
        formatInfo.glBaseInternalformat = GL_INVALID_VALUE;
    } else {
        formatInfo.glFormat = vkFormat2glFormat(This->vkFormat);
        formatInfo.glType = vkFormat2glType(This->vkFormat);
        formatInfo.glBaseInternalformat = formatInfo.glInternalformat;

        if (formatInfo.glFormat == GL_INVALID_VALUE || formatInfo.glType == GL_INVALID_VALUE)
            return KTX_INVALID_OPERATION;
    }
    /* KTX 2 files require an unpack alignment of 1. OGL default is 4. */
    glGetIntegerv(GL_UNPACK_ALIGNMENT, &previousUnpackAlignment);
    if (previousUnpackAlignment != 1) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    }

    result = ktxTexture_GLUploadPrivate(ktxTexture(This), &formatInfo,
                                        pTexture, pTarget, pGlerror);

    /* restore previous GL state */
    if (previousUnpackAlignment != 1) {
        glPixelStorei(GL_UNPACK_ALIGNMENT, previousUnpackAlignment);
    }

    return result;
}